

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualMemory.c
# Opt level: O1

void * sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping
                 (size_t sizeToAllocate,void **writeableMapping,void **executableMapping)

{
  uint __fd;
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *extraout_RAX;
  undefined4 extraout_var;
  void *in_RCX;
  void *__addr;
  size_t sVar4;
  char *__len;
  
  *writeableMapping = (void *)0x0;
  *executableMapping = (void *)0x0;
  __len = "sysbvm_code";
  iVar2 = 1;
  __fd = memfd_create();
  if ((int)__fd < 0) {
    sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping_cold_4();
LAB_001589b1:
    sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping_cold_3();
  }
  else {
    __len = (char *)(ulong)__fd;
    sVar4 = sizeToAllocate;
    iVar1 = ftruncate(__fd,sizeToAllocate);
    iVar2 = (int)sVar4;
    if (iVar1 < 0) goto LAB_001589b1;
    __len = (char *)0x0;
    in_RCX = (void *)0x1;
    sVar4 = sizeToAllocate;
    pvVar3 = mmap((void *)0x0,sizeToAllocate,3,1,__fd,0);
    iVar2 = (int)sVar4;
    if (pvVar3 != (void *)0xffffffffffffffff) {
      *writeableMapping = pvVar3;
      __len = (char *)0x0;
      in_RCX = (void *)0x1;
      pvVar3 = mmap((void *)0x0,sizeToAllocate,5,1,__fd,0);
      iVar2 = (int)sizeToAllocate;
      if (pvVar3 != (void *)0xffffffffffffffff) {
        *executableMapping = pvVar3;
        return (void *)(ulong)__fd;
      }
      goto LAB_001589bb;
    }
  }
  sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping_cold_2();
LAB_001589bb:
  sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping_cold_1();
  if (-1 < iVar2) {
    munmap(__addr,(size_t)__len);
    munmap(in_RCX,(size_t)__len);
    iVar2 = close(iVar2);
    return (void *)CONCAT44(extraout_var,iVar2);
  }
  return extraout_RAX;
}

Assistant:

void *sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping(size_t sizeToAllocate, void **writeableMapping, void **executableMapping)
{
    *writeableMapping = NULL;
    *executableMapping = NULL;

    int fd = memfd_create("sysbvm_code", MFD_CLOEXEC);
    if(fd < 0)
    {
        perror("failed to make memfd.");
        abort();
    }

    if(ftruncate(fd, sizeToAllocate) < 0)
    {
        perror("failed to allocate memory with dual mapping for JIT execution.");
        abort();
    }

    // Read-Write mapping.
    void *mmapResult = mmap(0, sizeToAllocate, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    if(mmapResult == MAP_FAILED)
    {
        perror("failed to map read-write memory for JIT execution.");
        abort();
    }
    *writeableMapping = mmapResult;

    // Read-Execute mapping.
    mmapResult = mmap(0, sizeToAllocate, PROT_READ | PROT_EXEC, MAP_SHARED, fd, 0);
    if(mmapResult == MAP_FAILED)
    {
        perror("failed to map read-write memory for JIT execution.");
        abort();
    }
    *executableMapping = mmapResult;

    return (void*)(intptr_t)fd;
}